

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

bool __thiscall ChainstateManager::ValidatedSnapshotCleanup(ChainstateManager *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  _Head_base<0UL,_Chainstate_*,_false> _Var3;
  __uniq_ptr_data<CDBWrapper,_std::default_delete<CDBWrapper>,_true,_true> _Var4;
  Chainstate *pCVar5;
  bool bVar6;
  unique_ptr<CoinsViews,_std::default_delete<CoinsViews>_> *puVar7;
  char cVar8;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  path local_1f0 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158 [3];
  path local_e8;
  path tmp_old;
  path local_98;
  char local_70;
  optional<fs::path> ibd_chainstate_path_maybe;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  _Var3._M_head_impl =
       (this->m_ibd_chainstate)._M_t.
       super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
       super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
       super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
  if ((_Var3._M_head_impl == (Chainstate *)0x0) ||
     ((tuple<CoinsViews_*,_std::default_delete<CoinsViews>_>)
      *(tuple<CoinsViews_*,_std::default_delete<CoinsViews>_> *)
       &((_Var3._M_head_impl)->m_coins_views)._M_t ==
      (__uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_>)0x0)) {
LAB_0040921e:
    ibd_chainstate_path_maybe.super__Optional_base<fs::path,_false,_false>._M_payload.
    super__Optional_payload<fs::path,_true,_false,_false>.super__Optional_payload_base<fs::path>.
    _M_engaged = false;
  }
  else {
    puVar7 = inline_assertion_check<true,std::unique_ptr<CoinsViews,std::default_delete<CoinsViews>>&>
                       (&(_Var3._M_head_impl)->m_coins_views,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.h"
                        ,0x271,"CoinsDB","m_coins_views");
    _Var4.super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t.
    super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
    super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl =
         (((puVar7->_M_t).super___uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_>._M_t.
           super__Tuple_impl<0UL,_CoinsViews_*,_std::default_delete<CoinsViews>_>.
           super__Head_base<0UL,_CoinsViews_*,_false>._M_head_impl)->m_dbview).m_db._M_t.
         super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>;
    if (*(char *)((long)_Var4.super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>.
                        _M_t.super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
                        super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl + 0x68) != '\0')
    goto LAB_0040921e;
    std::filesystem::__cxx11::path::path
              ((path *)&ibd_chainstate_path_maybe,
               (path *)((long)_Var4.
                              super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>
                              .super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl + 0x40));
    ibd_chainstate_path_maybe.super__Optional_base<fs::path,_false,_false>._M_payload.
    super__Optional_payload<fs::path,_true,_false,_false>.super__Optional_payload_base<fs::path>.
    _M_engaged = true;
  }
  pCVar5 = (this->m_snapshot_chainstate)._M_t.
           super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
           super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
           super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
  if (pCVar5 == (Chainstate *)0x0) {
    local_70 = '\0';
  }
  else {
    if ((_Head_base<0UL,_CoinsViews_*,_false>)
        *(_Tuple_impl<0UL,_CoinsViews_*,_std::default_delete<CoinsViews>_> *)
         &(pCVar5->m_coins_views)._M_t.
          super___uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_> == (CoinsViews *)0x0)
    {
LAB_00409267:
      cVar8 = '\0';
    }
    else {
      puVar7 = inline_assertion_check<true,std::unique_ptr<CoinsViews,std::default_delete<CoinsViews>>&>
                         (&pCVar5->m_coins_views,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.h"
                          ,0x271,"CoinsDB","m_coins_views");
      _Var4.super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t.
      super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
      super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl =
           (((puVar7->_M_t).super___uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_>._M_t
             .super__Tuple_impl<0UL,_CoinsViews_*,_std::default_delete<CoinsViews>_>.
             super__Head_base<0UL,_CoinsViews_*,_false>._M_head_impl)->m_dbview).m_db._M_t.
           super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>;
      if (*(char *)((long)_Var4.super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
                          super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl + 0x68) != '\0')
      goto LAB_00409267;
      cVar8 = '\x01';
      std::filesystem::__cxx11::path::path
                (&local_98,
                 (path *)((long)_Var4.
                                super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>.
                                _M_t.
                                super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>
                                .super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl + 0x40));
    }
    local_70 = cVar8;
    if ((((this->m_snapshot_chainstate)._M_t.
          super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
          super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
          super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl != (Chainstate *)0x0) &&
        (_Var3._M_head_impl =
              (this->m_ibd_chainstate)._M_t.
              super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
              super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
              super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl,
        _Var3._M_head_impl != (Chainstate *)0x0)) && ((_Var3._M_head_impl)->m_disabled != false)) {
      if ((ibd_chainstate_path_maybe.super__Optional_base<fs::path,_false,_false>._M_payload.
           super__Optional_payload<fs::path,_true,_false,_false>.
           super__Optional_payload_base<fs::path>._M_engaged == true) && (cVar8 != '\0')) {
        ResetChainstates(this);
        GetAll((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)&tmp_old,this);
        if ((pointer)tmp_old.super_path._M_pathname._M_string_length !=
            tmp_old.super_path._M_pathname._M_dataplus._M_p) {
          __assert_fail("this->GetAll().size() == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                        ,0x191b,"bool ChainstateManager::ValidatedSnapshotCleanup()");
        }
        if (tmp_old.super_path._M_pathname._M_string_length != 0) {
          operator_delete(tmp_old.super_path._M_pathname._M_dataplus._M_p,
                          tmp_old.super_path._M_pathname.field_2._M_allocated_capacity -
                          (long)tmp_old.super_path._M_pathname._M_dataplus._M_p);
        }
        paVar1 = &tmp_old.super_path._M_pathname.field_2;
        tmp_old.super_path._M_pathname._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&tmp_old,
                   ibd_chainstate_path_maybe.super__Optional_base<fs::path,_false,_false>._M_payload
                   .super__Optional_payload<fs::path,_true,_false,_false>.
                   super__Optional_payload_base<fs::path>._M_payload._M_value.super_path._M_pathname
                   ._M_dataplus._M_p,
                   ibd_chainstate_path_maybe.super__Optional_base<fs::path,_false,_false>._M_payload
                   .super__Optional_payload<fs::path,_true,_false,_false>.
                   super__Optional_payload_base<fs::path>._M_payload._M_value.super_path._M_pathname
                   ._M_string_length +
                   (long)ibd_chainstate_path_maybe.super__Optional_base<fs::path,_false,_false>.
                         _M_payload.super__Optional_payload<fs::path,_true,_false,_false>.
                         super__Optional_payload_base<fs::path>._M_payload._M_value.super_path.
                         _M_pathname._M_dataplus._M_p);
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
        ;
        source_file._M_len = 0x5e;
        logging_function._M_str = "ValidatedSnapshotCleanup";
        logging_function._M_len = 0x18;
        LogPrintFormatInternal<std::__cxx11::string>
                  (logging_function,source_file,0x191e,ALL,Info,(ConstevalFormatString<1U>)0x810b80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmp_old);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)tmp_old.super_path._M_pathname._M_dataplus._M_p != paVar1) {
          operator_delete(tmp_old.super_path._M_pathname._M_dataplus._M_p,
                          tmp_old.super_path._M_pathname.field_2._M_allocated_capacity + 1);
        }
        std::filesystem::__cxx11::path::path(&local_e8,(path *)&ibd_chainstate_path_maybe);
        std::filesystem::__cxx11::path::_M_concat(&local_e8,9,"_todelete");
        std::filesystem::__cxx11::path::path(&tmp_old.super_path,&local_e8);
        std::filesystem::__cxx11::path::~path(&local_e8);
        std::filesystem::rename((path *)&ibd_chainstate_path_maybe,&tmp_old.super_path);
        paVar1 = &local_158[0].field_2;
        local_158[0]._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_158,local_98._M_pathname._M_dataplus._M_p,
                   local_98._M_pathname._M_dataplus._M_p + local_98._M_pathname._M_string_length);
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_178,
                   ibd_chainstate_path_maybe.super__Optional_base<fs::path,_false,_false>._M_payload
                   .super__Optional_payload<fs::path,_true,_false,_false>.
                   super__Optional_payload_base<fs::path>._M_payload._M_value.super_path._M_pathname
                   ._M_dataplus._M_p,
                   ibd_chainstate_path_maybe.super__Optional_base<fs::path,_false,_false>._M_payload
                   .super__Optional_payload<fs::path,_true,_false,_false>.
                   super__Optional_payload_base<fs::path>._M_payload._M_value.super_path._M_pathname
                   ._M_string_length +
                   (long)ibd_chainstate_path_maybe.super__Optional_base<fs::path,_false,_false>.
                         _M_payload.super__Optional_payload<fs::path,_true,_false,_false>.
                         super__Optional_payload_base<fs::path>._M_payload._M_value.super_path.
                         _M_pathname._M_dataplus._M_p);
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
        ;
        source_file_00._M_len = 0x5e;
        logging_function_00._M_str = "ValidatedSnapshotCleanup";
        logging_function_00._M_len = 0x18;
        LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                  (logging_function_00,source_file_00,0x1937,ALL,Info,
                   (ConstevalFormatString<2U>)0x810bd6,local_158,&local_178);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_158[0]._M_dataplus._M_p,
                          local_158[0].field_2._M_allocated_capacity + 1);
        }
        std::filesystem::rename(&local_98,(path *)&ibd_chainstate_path_maybe);
        std::filesystem::__cxx11::path::path(local_1f0,&tmp_old.super_path);
        bVar6 = DeleteCoinsDBFromDisk((path *)local_1f0,false);
        std::filesystem::__cxx11::path::~path(local_1f0);
        if (bVar6) {
          local_158[0]._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_158,
                     ibd_chainstate_path_maybe.super__Optional_base<fs::path,_false,_false>.
                     _M_payload.super__Optional_payload<fs::path,_true,_false,_false>.
                     super__Optional_payload_base<fs::path>._M_payload._M_value.super_path.
                     _M_pathname._M_dataplus._M_p,
                     ibd_chainstate_path_maybe.super__Optional_base<fs::path,_false,_false>.
                     _M_payload.super__Optional_payload<fs::path,_true,_false,_false>.
                     super__Optional_payload_base<fs::path>._M_payload._M_value.super_path.
                     _M_pathname._M_string_length +
                     (long)ibd_chainstate_path_maybe.super__Optional_base<fs::path,_false,_false>.
                           _M_payload.super__Optional_payload<fs::path,_true,_false,_false>.
                           super__Optional_payload_base<fs::path>._M_payload._M_value.super_path.
                           _M_pathname._M_dataplus._M_p);
          source_file_01._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
          ;
          source_file_01._M_len = 0x5e;
          logging_function_01._M_str = "ValidatedSnapshotCleanup";
          logging_function_01._M_len = 0x18;
          LogPrintFormatInternal<std::__cxx11::string>
                    (logging_function_01,source_file_01,0x1948,ALL,Info,
                     (ConstevalFormatString<1U>)0x810c7f,local_158);
        }
        else {
          local_158[0]._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_158,tmp_old.super_path._M_pathname._M_dataplus._M_p,
                     tmp_old.super_path._M_pathname._M_dataplus._M_p +
                     tmp_old.super_path._M_pathname._M_string_length);
          source_file_03._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
          ;
          source_file_03._M_len = 0x5e;
          logging_function_03._M_str = "ValidatedSnapshotCleanup";
          logging_function_03._M_len = 0x18;
          LogPrintFormatInternal<std::__cxx11::string>
                    (logging_function_03,source_file_03,0x1945,ALL,Info,
                     (ConstevalFormatString<1U>)0x810c27,local_158);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_158[0]._M_dataplus._M_p,
                          local_158[0].field_2._M_allocated_capacity + 1);
        }
        std::filesystem::__cxx11::path::~path(&tmp_old.super_path);
        bVar6 = true;
        goto LAB_004095d0;
      }
      source_file_02._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
      ;
      source_file_02._M_len = 0x5e;
      logging_function_02._M_str = "ValidatedSnapshotCleanup";
      logging_function_02._M_len = 0x18;
      LogPrintFormatInternal<>
                (logging_function_02,source_file_02,0x190b,ALL,Info,
                 (ConstevalFormatString<0U>)0x810ac8);
    }
  }
  bVar6 = false;
LAB_004095d0:
  if (local_70 == '\x01') {
    local_70 = '\0';
    std::filesystem::__cxx11::path::~path(&local_98);
  }
  if (ibd_chainstate_path_maybe.super__Optional_base<fs::path,_false,_false>._M_payload.
      super__Optional_payload<fs::path,_true,_false,_false>.super__Optional_payload_base<fs::path>.
      _M_engaged == true) {
    ibd_chainstate_path_maybe.super__Optional_base<fs::path,_false,_false>._M_payload.
    super__Optional_payload<fs::path,_true,_false,_false>.super__Optional_payload_base<fs::path>.
    _M_engaged = false;
    std::filesystem::__cxx11::path::~path((path *)&ibd_chainstate_path_maybe);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool ChainstateManager::ValidatedSnapshotCleanup()
{
    AssertLockHeld(::cs_main);
    auto get_storage_path = [](auto& chainstate) EXCLUSIVE_LOCKS_REQUIRED(::cs_main) -> std::optional<fs::path> {
        if (!(chainstate && chainstate->HasCoinsViews())) {
            return {};
        }
        return chainstate->CoinsDB().StoragePath();
    };
    std::optional<fs::path> ibd_chainstate_path_maybe = get_storage_path(m_ibd_chainstate);
    std::optional<fs::path> snapshot_chainstate_path_maybe = get_storage_path(m_snapshot_chainstate);

    if (!this->IsSnapshotValidated()) {
        // No need to clean up.
        return false;
    }
    // If either path doesn't exist, that means at least one of the chainstates
    // is in-memory, in which case we can't do on-disk cleanup. You'd better be
    // in a unittest!
    if (!ibd_chainstate_path_maybe || !snapshot_chainstate_path_maybe) {
        LogPrintf("[snapshot] snapshot chainstate cleanup cannot happen with "
                  "in-memory chainstates. You are testing, right?\n");
        return false;
    }

    const auto& snapshot_chainstate_path = *snapshot_chainstate_path_maybe;
    const auto& ibd_chainstate_path = *ibd_chainstate_path_maybe;

    // Since we're going to be moving around the underlying leveldb filesystem content
    // for each chainstate, make sure that the chainstates (and their constituent
    // CoinsViews members) have been destructed first.
    //
    // The caller of this method will be responsible for reinitializing chainstates
    // if they want to continue operation.
    this->ResetChainstates();

    // No chainstates should be considered usable.
    assert(this->GetAll().size() == 0);

    LogPrintf("[snapshot] deleting background chainstate directory (now unnecessary) (%s)\n",
              fs::PathToString(ibd_chainstate_path));

    fs::path tmp_old{ibd_chainstate_path + "_todelete"};

    auto rename_failed_abort = [this](
                                   fs::path p_old,
                                   fs::path p_new,
                                   const fs::filesystem_error& err) {
        LogError("[snapshot] Error renaming path (%s) -> (%s): %s\n",
                  fs::PathToString(p_old), fs::PathToString(p_new), err.what());
        GetNotifications().fatalError(strprintf(_(
            "Rename of '%s' -> '%s' failed. "
            "Cannot clean up the background chainstate leveldb directory."),
            fs::PathToString(p_old), fs::PathToString(p_new)));
    };

    try {
        fs::rename(ibd_chainstate_path, tmp_old);
    } catch (const fs::filesystem_error& e) {
        rename_failed_abort(ibd_chainstate_path, tmp_old, e);
        throw;
    }

    LogPrintf("[snapshot] moving snapshot chainstate (%s) to "
              "default chainstate directory (%s)\n",
              fs::PathToString(snapshot_chainstate_path), fs::PathToString(ibd_chainstate_path));

    try {
        fs::rename(snapshot_chainstate_path, ibd_chainstate_path);
    } catch (const fs::filesystem_error& e) {
        rename_failed_abort(snapshot_chainstate_path, ibd_chainstate_path, e);
        throw;
    }

    if (!DeleteCoinsDBFromDisk(tmp_old, /*is_snapshot=*/false)) {
        // No need to FatalError because once the unneeded bg chainstate data is
        // moved, it will not interfere with subsequent initialization.
        LogPrintf("Deletion of %s failed. Please remove it manually, as the "
                  "directory is now unnecessary.\n",
                  fs::PathToString(tmp_old));
    } else {
        LogPrintf("[snapshot] deleted background chainstate directory (%s)\n",
                  fs::PathToString(ibd_chainstate_path));
    }
    return true;
}